

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

void update_loff(hts_idx_t *idx,int i,int free_lidx)

{
  uint uVar1;
  uint uVar2;
  kh_bin_t *h;
  uint64_t *puVar3;
  khint_t kVar4;
  uint uVar5;
  uint64_t uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  lidx_t *plVar12;
  
  h = idx->bidx[i];
  plVar12 = idx->lidx + i;
  if (h == (kh_bin_t *)0x0) {
    uVar10 = plVar12->n;
    uVar9 = 1;
  }
  else {
    kVar4 = kh_get_bin(h,idx->n_bins + 1);
    uVar8 = 0;
    if (kVar4 == h->n_buckets) {
      uVar6 = 0;
    }
    else {
      uVar6 = (h->vals[kVar4].list)->u;
    }
    uVar10 = plVar12->n;
    uVar9 = 0;
    if (0 < (int)uVar10) {
      uVar9 = (ulong)uVar10;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      if (plVar12->offset[uVar8] != 0xffffffffffffffff) {
        uVar9 = uVar8 & 0xffffffff;
        break;
      }
      plVar12->offset[uVar8] = uVar6;
    }
  }
  for (; (long)uVar9 < (long)(int)uVar10; uVar9 = uVar9 + 1) {
    puVar3 = plVar12->offset;
    if (puVar3[uVar9] == 0xffffffffffffffff) {
      puVar3[uVar9] = puVar3[uVar9 - 1];
    }
  }
  if (h != (kh_bin_t *)0x0) {
    uVar1 = h->n_buckets;
    for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
      if ((h->flags[uVar9 >> 4 & 0xfffffff] >> ((char)uVar9 * '\x02' & 0x1fU) & 3) == 0) {
        uVar2 = h->keys[uVar9];
        if (uVar2 < (uint)idx->n_bins) {
          bVar7 = 0;
          for (uVar5 = uVar2; uVar5 != 0; uVar5 = (int)(uVar5 - 1) >> 3) {
            bVar7 = bVar7 + 3;
          }
          iVar11 = uVar2 - (uint)~(-1 << (bVar7 & 0x1f)) / 7 <<
                   ((char)idx->n_lvls * '\x03' - bVar7 & 0x1f);
          if ((int)uVar10 <= iVar11) goto LAB_0010b93c;
          uVar6 = plVar12->offset[iVar11];
        }
        else {
LAB_0010b93c:
          uVar6 = 0;
        }
        h->vals[uVar9].loff = uVar6;
      }
    }
    if (free_lidx != 0) {
      free(plVar12->offset);
      plVar12->n = 0;
      plVar12->m = 0;
      plVar12->offset = (uint64_t *)0x0;
    }
  }
  return;
}

Assistant:

static void update_loff(hts_idx_t *idx, int i, int free_lidx)
{
    bidx_t *bidx = idx->bidx[i];
    lidx_t *lidx = &idx->lidx[i];
    khint_t k;
    int l;
    uint64_t offset0 = 0;
    if (bidx) {
        k = kh_get(bin, bidx, META_BIN(idx));
        if (k != kh_end(bidx))
            offset0 = kh_val(bidx, k).list[0].u;
        for (l = 0; l < lidx->n && lidx->offset[l] == (uint64_t)-1; ++l)
            lidx->offset[l] = offset0;
    } else l = 1;
    for (; l < lidx->n; ++l) // fill missing values
        if (lidx->offset[l] == (uint64_t)-1)
            lidx->offset[l] = lidx->offset[l-1];
    if (bidx == 0) return;
    for (k = kh_begin(bidx); k != kh_end(bidx); ++k) // set loff
        if (kh_exist(bidx, k))
        {
            if ( kh_key(bidx, k) < idx->n_bins )
            {
                int bot_bin = hts_bin_bot(kh_key(bidx, k), idx->n_lvls);
                // disable linear index if bot_bin out of bounds
                kh_val(bidx, k).loff = bot_bin < lidx->n ? lidx->offset[bot_bin] : 0;
            }
            else
                kh_val(bidx, k).loff = 0;
        }
    if (free_lidx) {
        free(lidx->offset);
        lidx->m = lidx->n = 0;
        lidx->offset = 0;
    }
}